

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O2

bool __thiscall
jrtplib::RTPUDPv6Transmitter::ShouldAcceptData
          (RTPUDPv6Transmitter *this,in6_addr srcip,uint16_t srcport)

{
  list<unsigned_short,_std::allocator<unsigned_short>_> *plVar1;
  ReceiveMode RVar2;
  HashElement *pHVar3;
  _List_node_base *p_Var4;
  bool bVar5;
  anon_union_16_3_a3f0114d_for___in6_u local_28;
  
  local_28._8_8_ = srcip.__in6_u._8_8_;
  local_28._0_8_ = srcip.__in6_u._0_8_;
  RVar2 = this->receivemode;
  RTPKeyHashTable<const_in6_addr,_jrtplib::RTPUDPv6Transmitter::PortInfo_*,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>
  ::GotoElement(&this->acceptignoreinfo,(in6_addr *)&local_28);
  pHVar3 = (this->acceptignoreinfo).curhashelem;
  if (RVar2 == AcceptSome) {
    if (pHVar3 == (HashElement *)0x0) {
      bVar5 = false;
    }
    else {
      plVar1 = &pHVar3->element->portlist;
      p_Var4 = (_List_node_base *)plVar1;
      if (pHVar3->element->all == false) {
        do {
          p_Var4 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var4->_M_next
                    )->_M_impl)._M_node.super__List_node_base._M_next;
          bVar5 = p_Var4 != (_List_node_base *)plVar1;
          if (p_Var4 == (_List_node_base *)plVar1) {
            return bVar5;
          }
        } while (*(uint16_t *)&p_Var4[1]._M_next != srcport);
      }
      else {
        do {
          p_Var4 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var4->_M_next
                    )->_M_impl)._M_node.super__List_node_base._M_next;
          bVar5 = p_Var4 == (_List_node_base *)plVar1;
          if (bVar5) {
            return bVar5;
          }
        } while (*(uint16_t *)&p_Var4[1]._M_next != srcport);
      }
    }
  }
  else if (pHVar3 == (HashElement *)0x0) {
    bVar5 = true;
  }
  else {
    plVar1 = &pHVar3->element->portlist;
    p_Var4 = (_List_node_base *)plVar1;
    if (pHVar3->element->all == false) {
      do {
        p_Var4 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var4->_M_next)
                 ->_M_impl)._M_node.super__List_node_base._M_next;
        bVar5 = p_Var4 == (_List_node_base *)plVar1;
        if (bVar5) {
          return bVar5;
        }
      } while (*(uint16_t *)&p_Var4[1]._M_next != srcport);
    }
    else {
      do {
        p_Var4 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var4->_M_next)
                 ->_M_impl)._M_node.super__List_node_base._M_next;
        bVar5 = p_Var4 != (_List_node_base *)plVar1;
        if (p_Var4 == (_List_node_base *)plVar1) {
          return bVar5;
        }
      } while (*(uint16_t *)&p_Var4[1]._M_next != srcport);
    }
  }
  return bVar5;
}

Assistant:

bool RTPUDPv6Transmitter::ShouldAcceptData(in6_addr srcip,uint16_t srcport)
{
	if (receivemode == RTPTransmitter::AcceptSome)
	{
		PortInfo *inf;

		acceptignoreinfo.GotoElement(srcip);
		if (!acceptignoreinfo.HasCurrentElement())
			return false;
		
		inf = acceptignoreinfo.GetCurrentElement();
		if (!inf->all) // only accept the ones in the list
		{
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == srcport)
					return true;
			}
			return false;
		}
		else // accept all, except the ones in the list
		{
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == srcport)
					return false;
			}
			return true;
		}
	}
	else // IgnoreSome
	{
		PortInfo *inf;

		acceptignoreinfo.GotoElement(srcip);
		if (!acceptignoreinfo.HasCurrentElement())
			return true;
		
		inf = acceptignoreinfo.GetCurrentElement();
		if (!inf->all) // ignore the ports in the list
		{
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == srcport)
					return false;
			}
			return true;
		}
		else // ignore all, except the ones in the list
		{
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == srcport)
					return true;
			}
			return false;
		}
	}
	return true;
}